

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obuf.c
# Opt level: O2

void obuf_reset(obuf *buf)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar1 = (buf->pos + 1) - (uint)(buf->iov[buf->pos].iov_len == 0);
  uVar3 = 0;
  uVar2 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar2 = uVar3;
  }
  for (; uVar2 * 0x10 != uVar3; uVar3 = uVar3 + 0x10) {
    *(undefined8 *)((long)&buf->iov[0].iov_len + uVar3) = 0;
  }
  buf->pos = 0;
  buf->used = 0;
  buf->reserved = false;
  return;
}

Assistant:

void
obuf_reset(struct obuf *buf)
{
	int iovcnt = obuf_iovcnt(buf);
	int i;
	for (i = 0; i < iovcnt; i++)
		buf->iov[i].iov_len = 0;
	buf->pos = 0;
	buf->used = 0;
#ifndef NDEBUG
	buf->reserved = false;
#endif
}